

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O2

bool __thiscall
Clasp::UncoreMinimize::addK
          (UncoreMinimize *this,Solver *s,uint32 k,LitPair *lits,uint32 size,weight_t w)

{
  WCTemp *this_00;
  LitVec *lits_00;
  OptParams OVar1;
  uint32 size_00;
  uint uVar2;
  Literal LVar3;
  uint uVar4;
  size_type sVar5;
  LitPair LVar6;
  uint uVar7;
  WeightLiteral *lits_01;
  uint32 i;
  int iVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  double dVar12;
  __type_conflict _Var13;
  Result RVar14;
  ulong uStack_90;
  Literal bin [2];
  Literal local_78;
  LitPair *local_70;
  undefined8 local_68;
  uint local_60;
  weight_t local_5c;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  UncoreMinimize *local_38;
  
  OVar1 = this->options_;
  local_50 = (ulong)size;
  local_5c = w;
  if (k == 0) {
    if (size < 9) {
      local_40 = 1;
    }
    else {
      dVar12 = (double)local_50;
      _Var13 = std::log10<unsigned_int>(size);
      dVar12 = ceil(dVar12 / ((_Var13 * 16.0 + -2.0) * 0.5));
      local_40 = (ulong)(uint)(int)dVar12;
    }
  }
  else {
    local_40 = (ulong)((size + k) - 1) / (ulong)k;
  }
  bin[0].rep_ = 0;
  bin[1].rep_ = 0;
  local_40 = ((size + (int)local_40) - 1) / local_40;
  local_78.rep_ = (lits->lit).rep_ & 0xfffffffe ^ 2;
  local_60 = (int)local_40 + 1;
  this_00 = &this->temp_;
  local_48 = (ulong)-size;
  local_58 = (ulong)size;
  local_38 = this;
  uVar4 = 1;
  while( true ) {
    uVar7 = (int)local_40 + uVar4;
    uVar2 = (uint)local_58 - uVar4;
    uVar10 = (ulong)uVar2;
    if (uVar7 < (uint)local_58) {
      uVar10 = local_40 & 0xffffffff;
      uVar2 = local_60;
    }
    (this->temp_).lits.ebo_.size = 0;
    (this->temp_).bound = uVar2;
    WCTemp::add(this_00,s,local_78);
    for (iVar8 = 0; this = local_38, uVar2 = iVar8 + uVar4, (int)uVar10 != iVar8; iVar8 = iVar8 + 1)
    {
      WCTemp::add(this_00,s,(Literal)(lits[uVar2].lit.rep_ & 0xfffffffe ^ 2));
    }
    bVar11 = uVar7 < (uint)local_58;
    if (bVar11) {
      local_78 = newLit(local_38,s);
      bin[0].rep_ = local_78.rep_;
      WCTemp::add(this_00,s,(Literal)(local_78.rep_ & 0xfffffffe ^ 2));
    }
    iVar8 = (int)local_48;
    uStack_90 = (ulong)bVar11;
    while (iVar9 = (int)uVar10, uVar10 = (ulong)(iVar9 - 1), iVar9 != 0) {
      LVar3 = newLit(this,s);
      LVar6 = newAssumption(this,LVar3,local_5c);
      bin[uStack_90].rep_ = LVar6.lit.rep_.rep_;
      WCTemp::add(this_00,s,(Literal)(LVar6.lit.rep_.rep_ & 0xfffffffe ^ 2));
      if ((int)uStack_90 != 0) {
        LVar3.rep_ = bin[1].rep_;
        addImplication(this,s,bin[0],bin[1],(bool)((byte)((uint)OVar1 >> 9) & 1));
        bin[0].rep_ = LVar3.rep_;
      }
      uStack_90 = 1;
    }
    size_00 = (this->temp_).lits.ebo_.size;
    if (size_00 == 0) {
      lits_01 = (WeightLiteral *)0x0;
    }
    else {
      lits_01 = (this->temp_).lits.ebo_.buf;
    }
    bVar11 = addConstraint(this,s,lits_01,size_00,(this->temp_).bound);
    if (!bVar11) break;
    uVar4 = uVar2;
    if (iVar8 + uVar2 == 0) {
      sVar5 = (s->conflict_).ebo_.size;
      if (((uint)OVar1 & 0x200) == 0 && sVar5 == 0) {
        lits_00 = &this->conflict_;
        uVar10 = local_50;
        local_70 = lits;
        while (bVar11 = uVar10 != 0, uVar10 = uVar10 - 1, bVar11) {
          bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                    (lits_00,&local_70->lit);
          local_70 = local_70 + 1;
        }
        uVar4 = 0;
        while( true ) {
          if (this->eRoot_ < uVar4 + 1) break;
          local_68 = (ClauseHead *)
                     (CONCAT44(local_68._4_4_,
                               *(undefined4 *)
                                ((long)&((s->assign_).trail.ebo_.buf)->rep_ +
                                (ulong)(uint)(*(int *)((s->levels_).super_type.ebo_.buf + uVar4) <<
                                             2))) & 0xfffffffffffffffe ^ 2);
          bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                    (lits_00,(Literal *)&local_68);
          uVar4 = uVar4 + 1;
        }
        local_68 = (ClauseHead *)CONCAT44(local_68._4_4_,0x30000000);
        RVar14 = ClauseCreator::create(s,lits_00,0xb,(ConstraintInfo *)&local_68);
        local_68 = RVar14.local;
        if (local_68 != (ClauseHead *)0x0) {
          bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::push_back
                    (&this->closed_,(Constraint **)&local_68);
        }
        (this->conflict_).ebo_.size = 0;
        sVar5 = (s->conflict_).ebo_.size;
      }
      return sVar5 == 0;
    }
  }
  return false;
}

Assistant:

bool UncoreMinimize::addK(Solver& s, uint32 k, const LitPair* lits, uint32 size, weight_t w) {
	const bool concise = options_.hasOption(OptParams::usc_succinct);
	const int x = k ? (size + (k-1)) / k
	            : size <= 8 ? 1
	            : (int)std::ceil(size / (((std::log10(size)*16)-2)/2.0));
	k = (size + (x-1)) / x;
	uint32 idx = 1;
	Literal cp = ~lits[0].lit, bin[2];
	do {
		uint32 n = k, connect = uint32((idx + k) < size);
		if (!connect) {
			n = size - idx;
		}
		weight_t B = static_cast<weight_t>(n + connect);
		temp_.start(B);
		temp_.add(s, cp);
		for (uint32 i = 0; i != n; ++i) {
			temp_.add(s, ~lits[idx++].lit);
		}
		if (connect) {
			bin[0] = newLit(s);
			temp_.add(s, ~bin[0]);
			cp = bin[0];
		}
		for (uint32 i = 0, b = connect; i != n; ++i, b = 1) {
			Literal ri = newAssumption(newLit(s), w).lit;
			bin[b] = ri;
			temp_.add(s, ~ri);
			if (b) { // bin[0] -> bin[1];
				addImplication(s, bin[0], bin[1], concise);
				bin[0] = bin[1];
			}
		}
		if (!addConstraint(s, temp_.begin(), temp_.size(), temp_.bound)) {
			return false;
		}
	} while (idx != size);
	if (!concise && !s.hasConflict()) {
		typedef ClauseCreator::Result Result;
		const uint32 flags = ClauseCreator::clause_explicit | ClauseCreator::clause_not_root_sat | ClauseCreator::clause_no_add;
		for (uint32 i = 0; i != size; ++i)   { conflict_.push_back(lits[i].lit); }
		for (uint32 i = 1; i <= eRoot_; ++i) { conflict_.push_back(~s.decision(i)); }
		Result res = ClauseCreator::create(s, conflict_, flags, Constraint_t::Other);
		if (res.local) { closed_.push_back(res.local); }
		conflict_.clear();
	}
	return !s.hasConflict();
}